

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2-sse2.c
# Opt level: O2

void fill_segment_sse2(argon2_instance_t *instance,argon2_position_t position)

{
  bool bVar1;
  uint32_t uVar2;
  uint64_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  argon2_position_t local_c50;
  uint local_c3c;
  block input_block;
  block address_block;
  longlong local_438 [129];
  
  uVar4 = position._8_8_;
  uVar5 = position._0_8_;
  if (instance != (argon2_instance_t *)0x0) {
    local_c50._0_8_ = uVar5;
    local_c50._8_8_ = uVar4;
    if ((instance->type == Argon2_i) ||
       (position.slice < 2 && (instance->type == Argon2_id && position.pass == 0))) {
      init_block_value(&input_block,'\0');
      input_block.v[0] = uVar5 & 0xffffffff;
      input_block.v[2] = uVar4 & 0xff;
      input_block.v[3] = (uint64_t)instance->memory_blocks;
      input_block.v[4] = (uint64_t)instance->passes;
      input_block.v[5] = (uint64_t)instance->type;
      uVar4 = CONCAT71((int7)((ulong)&input_block >> 8),1);
      input_block.v[1] = uVar5 >> 0x20;
    }
    else {
      uVar4 = 0;
    }
    bVar1 = position.slice == 0 && position.pass == 0;
    if ((bVar1 & (byte)uVar4) == 1) {
      next_addresses(&address_block,&input_block);
      uVar9 = 2;
    }
    else {
      uVar9 = (uint)bVar1 * 2;
    }
    uVar2 = instance->segment_length;
    uVar6 = instance->lane_length;
    uVar8 = position.lane * uVar6 + uVar9 + (position._8_4_ & 0xff) * uVar2;
    uVar5 = (ulong)((-(uint)(uVar8 % uVar6 != 0) | uVar6 - 1) + uVar8);
    memcpy(local_438,instance->memory + uVar5,0x400);
    local_c3c = (uint)uVar4;
    for (; uVar9 < uVar2; uVar9 = uVar9 + 1) {
      if (uVar8 % instance->lane_length == 1) {
        uVar5 = (ulong)(uVar8 - 1);
      }
      if ((char)uVar4 == '\0') {
        puVar3 = instance->memory[uVar5].v;
      }
      else {
        if ((uVar9 & 0x7f) == 0) {
          next_addresses(&address_block,&input_block);
        }
        puVar3 = address_block.v + (uVar9 & 0x7f);
      }
      uVar4 = (*puVar3 >> 0x20) % (ulong)instance->lanes;
      uVar6 = 0;
      uVar7 = uVar4;
      if (local_c50.slice == '\0') {
        uVar7 = (ulong)local_c50._0_8_ >> 0x20;
      }
      if (local_c50.pass != 0) {
        uVar7 = uVar4;
      }
      local_c50.index = uVar9;
      uVar2 = index_alpha(instance,&local_c50,(uint32_t)*puVar3,
                          (uint)(uVar7 == (ulong)local_c50._0_8_ >> 0x20));
      if (local_c50.pass != 0) {
        uVar6 = (uint)(instance->version != 0x10);
      }
      fill_block((__m128i *)local_438,
                 instance->memory + uVar7 * instance->lane_length + (ulong)uVar2,
                 instance->memory + uVar8,uVar6);
      uVar8 = uVar8 + 1;
      uVar5 = (ulong)((int)uVar5 + 1);
      uVar2 = instance->segment_length;
      uVar4 = (ulong)local_c3c;
    }
  }
  return;
}

Assistant:

void fill_segment_sse2(const argon2_instance_t *instance,
                       argon2_position_t position)
{
    fill_segment_128(instance, position);
}